

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O3

void __thiscall HEkkDual::assessPhase1OptimalityUnperturbed(HEkkDual *this)

{
  double dVar1;
  HEkk *pHVar2;
  HighsLogOptions *log_options_;
  
  pHVar2 = this->ekk_instance_;
  if (this->dualInfeasCount != 0) {
    highsLogDev(&(pHVar2->options_->super_HighsOptionsStruct).log_options,kInfo,
                "LP has %d dual feasibilities wrt Phase 1 bounds after removing cost perturbations so return to phase 1\n"
               );
    return;
  }
  dVar1 = (pHVar2->info_).dual_objective_value;
  log_options_ = &(pHVar2->options_->super_HighsOptionsStruct).log_options;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    highsLogDev(log_options_,kInfo,
                "LP is dual feasible wrt Phase 1 bounds after removing cost perturbations: dual objective is %10.4g\n"
               );
    HEkk::computeSimplexLpDualInfeasible(this->ekk_instance_);
    if ((this->ekk_instance_->analysis_).num_dual_phase_1_lp_dual_infeasibility != 0) {
      reportOnPossibleLpDualInfeasibility(this);
      pHVar2->model_status_ = kUnboundedOrInfeasible;
      this->solve_phase = -2;
      return;
    }
    log_options_ = &(this->ekk_instance_->options_->super_HighsOptionsStruct).log_options;
  }
  highsLogDev(log_options_,kInfo,
              "LP is dual feasible wrt Phase 2 bounds after removing cost perturbations so go to phase 2\n"
             );
  this->solve_phase = 2;
  return;
}

Assistant:

void HEkkDual::assessPhase1OptimalityUnperturbed() {
  HighsSimplexInfo& info = ekk_instance_.info_;
  HighsModelStatus& model_status = ekk_instance_.model_status_;
  double& dual_objective_value = info.dual_objective_value;
  assert(!info.costs_perturbed);
  if (dualInfeasCount == 0) {
    // No dual infeasibilities with respect to phase 1 bounds.
    if (dual_objective_value == 0) {
      // No dual infeasibilities with respect to phase 2 bounds so
      // go to phase 2
      highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kInfo,
                  "LP is dual feasible wrt Phase 2 bounds after removing cost "
                  "perturbations so go to phase 2\n");
      solve_phase = kSolvePhase2;
    } else {
      // Nonzero dual objective value: could be insignificant dual
      // infeasibilities
      highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kInfo,
                  "LP is dual feasible wrt Phase 1 bounds after removing cost "
                  "perturbations: "
                  "dual objective is %10.4g\n",
                  dual_objective_value);
      ekk_instance_.computeSimplexLpDualInfeasible();
      const HighsInt num_lp_dual_infeasibilities =
          ekk_instance_.analysis_.num_dual_phase_1_lp_dual_infeasibility;
      if (num_lp_dual_infeasibilities == 0) {
        highsLogDev(
            ekk_instance_.options_->log_options, HighsLogType::kInfo,
            "LP is dual feasible wrt Phase 2 bounds after removing cost "
            "perturbations so go to phase 2\n");
        solve_phase = kSolvePhase2;
      } else {
        // LP is dual infeasible if the dual objective is sufficiently
        // negative, so no conclusions on the primal LP can be deduced
        // - could be primal unbounded or primal infeasible.
        //
        // Indicate the conclusion of dual infeasibility by setting
        // the scaled model status
        reportOnPossibleLpDualInfeasibility();
        model_status = HighsModelStatus::kUnboundedOrInfeasible;
        solve_phase = kSolvePhaseExit;
      }
    }
  } else {
    highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kInfo,
                "LP has %d dual feasibilities wrt Phase 1 bounds after "
                "removing cost perturbations "
                "so return to phase 1\n",
                dualInfeasCount);
    assert(solve_phase == kSolvePhase1);
  }
}